

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode.c
# Opt level: O1

ARKodeMem arkCreate(SUNContext_conflict sunctx)

{
  int iVar1;
  ARKodeMem __s;
  ARKodeHAdaptMem pAVar2;
  SUNAdaptController p_Var3;
  int iVar4;
  char *pcVar5;
  ARKodeMem ark_mem;
  long leniw;
  long lenrw;
  ARKodeMem local_38;
  long local_30;
  long local_28;
  
  if (sunctx == (SUNContext_conflict)0x0) {
    pcVar5 = "sunctx = NULL illegal.";
    iVar4 = -0x16;
    iVar1 = 0x55c;
  }
  else {
    local_38 = (ARKodeMem)0x0;
    __s = (ARKodeMem)malloc(0x3e0);
    if (__s != (ARKodeMem)0x0) {
      local_38 = __s;
      memset(__s,0,0x3e0);
      __s->sunctx = sunctx;
      __s->uround = 2.220446049250313e-16;
      __s->step_setrelaxfn = (ARKTimestepSetRelaxFn)0x0;
      __s->step_getestlocalerrors = (ARKTimestepGetEstLocalErrors)0x0;
      __s->step_supports_implicit = 0;
      __s->step_supports_relaxation = 0;
      __s->root_mem = (ARKodeRootMem)0x0;
      __s->constraintsSet = 0;
      __s->constraints = (N_Vector)0x0;
      __s->relax_enabled = 0;
      __s->relax_mem = (ARKodeRelaxMem)0x0;
      __s->step_mem = (void *)0x0;
      __s->step_init = (ARKTimestepInitFn)0x0;
      __s->step_fullrhs = (ARKTimestepFullRHSFn)0x0;
      __s->step = (ARKTimestepStepFn)0x0;
      __s->step_setuserdata = (ARKTimetepSetUserDataFn)0x0;
      __s->step_printallstats = (ARKTimestepPrintAllStats)0x0;
      __s->step_writeparameters = (ARKTimestepWriteParameters)0x0;
      __s->step_resize = (ARKTimestepResize)0x0;
      __s->step_reset = (ARKTimestepReset)0x0;
      __s->step_free = (ARKTimestepFree)0x0;
      __s->step_printmem = (ARKTimestepPrintMem)0x0;
      __s->step_setdefaults = (ARKTimestepSetDefaults)0x0;
      *(undefined1 (*) [16])((long)&__s->step_setdefaults + 4) = (undefined1  [16])0x0;
      memset(&__s->step_attachlinsol,0,0xd4);
      __s->step_attachmasssol = (ARKTimestepAttachMasssolFn)0x0;
      __s->step_disablemsetup = (ARKTimestepDisableMSetup)0x0;
      __s->step_getmassmem = (ARKTimestepGetMassMemFn)0x0;
      __s->step_mmult = (ARKMassMultFn)0x0;
      __s->lrw = 0x12;
      __s->liw = 0x35;
      __s->VabstolMallocDone = 0;
      __s->VRabstolMallocDone = 0;
      __s->MallocDone = 0;
      __s->user_data = (void *)0x0;
      __s->ProcessStep = (ARKPostProcessFn)0x0;
      __s->ps_data = (void *)0x0;
      __s->ProcessStage = (ARKPostProcessFn)0x0;
      pAVar2 = arkAdaptInit();
      __s->hadapt_mem = pAVar2;
      if (pAVar2 == (ARKodeHAdaptMem)0x0) {
        pcVar5 = "Allocation of step adaptivity structure failed";
        iVar4 = -0x14;
        iVar1 = 0x5c8;
      }
      else {
        __s->lrw = __s->lrw + 10;
        __s->liw = __s->liw + 7;
        p_Var3 = SUNAdaptController_PID(sunctx);
        pAVar2 = __s->hadapt_mem;
        pAVar2->hcontroller = p_Var3;
        if (p_Var3 == (SUNAdaptController)0x0) {
          pcVar5 = "Allocation of step controller object failed";
          iVar4 = -0x14;
          iVar1 = 0x5d4;
        }
        else {
          pAVar2->owncontroller = 1;
          SUNAdaptController_Space(p_Var3,&local_28,&local_30);
          __s->lrw = __s->lrw + local_28;
          __s->liw = __s->liw + local_30;
          __s->interp = (ARKInterp)0x0;
          __s->interp_type = 0;
          __s->interp_degree = 5;
          __s->rwt_is_ewt = 1;
          __s->call_fullrhs = 0;
          __s->initsetup = 1;
          __s->init_type = 0;
          __s->firststage = 1;
          __s->initialized = 0;
          __s->h = 0.0;
          __s->h0u = 0.0;
          iVar1 = ARKodeSetDefaults(__s);
          if (iVar1 == 0) {
            return __s;
          }
          pcVar5 = "Error setting default solver options";
          iVar4 = 0;
          iVar1 = 0x5fa;
        }
      }
      arkProcessError((ARKodeMem)0x0,iVar4,iVar1,"arkCreate",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/arkode/arkode.c"
                      ,pcVar5);
      ARKodeFree(&local_38);
      return (ARKodeMem)0x0;
    }
    pcVar5 = "Allocation of arkode_mem failed.";
    iVar4 = -0x14;
    iVar1 = 0x565;
    local_38 = (ARKodeMem)0x0;
  }
  arkProcessError((ARKodeMem)0x0,iVar4,iVar1,"arkCreate",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/arkode/arkode.c"
                  ,pcVar5);
  return (ARKodeMem)0x0;
}

Assistant:

ARKodeMem arkCreate(SUNContext sunctx)
{
  int iret;
  long int lenrw, leniw;
  ARKodeMem ark_mem;

  if (!sunctx)
  {
    arkProcessError(NULL, ARK_ILL_INPUT, __LINE__, __func__, __FILE__,
                    MSG_ARK_NULL_SUNCTX);
    return (NULL);
  }

  ark_mem = NULL;
  ark_mem = (ARKodeMem)malloc(sizeof(struct ARKodeMemRec));
  if (ark_mem == NULL)
  {
    arkProcessError(NULL, ARK_MEM_FAIL, __LINE__, __func__, __FILE__,
                    MSG_ARK_ARKMEM_FAIL);
    return (NULL);
  }

  /* Zero out ark_mem */
  memset(ark_mem, 0, sizeof(struct ARKodeMemRec));

  /* Set the context */
  ark_mem->sunctx = sunctx;

  /* Set uround */
  ark_mem->uround = SUN_UNIT_ROUNDOFF;

  /* Initialize time step module to NULL */
  ark_mem->step_attachlinsol              = NULL;
  ark_mem->step_attachmasssol             = NULL;
  ark_mem->step_disablelsetup             = NULL;
  ark_mem->step_disablemsetup             = NULL;
  ark_mem->step_getlinmem                 = NULL;
  ark_mem->step_getmassmem                = NULL;
  ark_mem->step_getimplicitrhs            = NULL;
  ark_mem->step_mmult                     = NULL;
  ark_mem->step_getgammas                 = NULL;
  ark_mem->step_init                      = NULL;
  ark_mem->step_fullrhs                   = NULL;
  ark_mem->step                           = NULL;
  ark_mem->step_setuserdata               = NULL;
  ark_mem->step_printallstats             = NULL;
  ark_mem->step_writeparameters           = NULL;
  ark_mem->step_resize                    = NULL;
  ark_mem->step_reset                     = NULL;
  ark_mem->step_free                      = NULL;
  ark_mem->step_printmem                  = NULL;
  ark_mem->step_setdefaults               = NULL;
  ark_mem->step_computestate              = NULL;
  ark_mem->step_setrelaxfn                = NULL;
  ark_mem->step_setorder                  = NULL;
  ark_mem->step_setnonlinearsolver        = NULL;
  ark_mem->step_setlinear                 = NULL;
  ark_mem->step_setnonlinear              = NULL;
  ark_mem->step_setautonomous             = NULL;
  ark_mem->step_setnlsrhsfn               = NULL;
  ark_mem->step_setdeduceimplicitrhs      = NULL;
  ark_mem->step_setnonlincrdown           = NULL;
  ark_mem->step_setnonlinrdiv             = NULL;
  ark_mem->step_setdeltagammamax          = NULL;
  ark_mem->step_setlsetupfrequency        = NULL;
  ark_mem->step_setpredictormethod        = NULL;
  ark_mem->step_setmaxnonliniters         = NULL;
  ark_mem->step_setnonlinconvcoef         = NULL;
  ark_mem->step_setstagepredictfn         = NULL;
  ark_mem->step_getnumlinsolvsetups       = NULL;
  ark_mem->step_getestlocalerrors         = NULL;
  ark_mem->step_getcurrentgamma           = NULL;
  ark_mem->step_getnonlinearsystemdata    = NULL;
  ark_mem->step_getnumnonlinsolviters     = NULL;
  ark_mem->step_getnumnonlinsolvconvfails = NULL;
  ark_mem->step_getnonlinsolvstats        = NULL;
  ark_mem->step_mem                       = NULL;
  ark_mem->step_supports_adaptive         = SUNFALSE;
  ark_mem->step_supports_implicit         = SUNFALSE;
  ark_mem->step_supports_massmatrix       = SUNFALSE;
  ark_mem->step_supports_relaxation       = SUNFALSE;

  /* Initialize root finding variables */
  ark_mem->root_mem = NULL;

  /* Initialize inequality constraints variables */
  ark_mem->constraintsSet = SUNFALSE;
  ark_mem->constraints    = NULL;

  /* Initialize relaxation variables */
  ark_mem->relax_enabled = SUNFALSE;
  ark_mem->relax_mem     = NULL;

  /* Initialize lrw and liw */
  ark_mem->lrw = 18;
  ark_mem->liw = 53; /* fcn/data ptr, int, long int, sunindextype, sunbooleantype */

  /* No mallocs have been done yet */
  ark_mem->VabstolMallocDone  = SUNFALSE;
  ark_mem->VRabstolMallocDone = SUNFALSE;
  ark_mem->MallocDone         = SUNFALSE;

  /* No user-supplied step postprocessing function yet */
  ark_mem->ProcessStep = NULL;
  ark_mem->ps_data     = NULL;

  /* No user-supplied stage postprocessing function yet */
  ark_mem->ProcessStage = NULL;

  /* No user_data pointer yet */
  ark_mem->user_data = NULL;

  /* Allocate step adaptivity structure and note storage */
  ark_mem->hadapt_mem = arkAdaptInit();
  if (ark_mem->hadapt_mem == NULL)
  {
    arkProcessError(NULL, ARK_MEM_FAIL, __LINE__, __func__, __FILE__,
                    "Allocation of step adaptivity structure failed");
    ARKodeFree((void**)&ark_mem);
    return (NULL);
  }
  ark_mem->lrw += ARK_ADAPT_LRW;
  ark_mem->liw += ARK_ADAPT_LIW;

  /* Allocate default step controller (PID) and note storage */
  ark_mem->hadapt_mem->hcontroller = SUNAdaptController_PID(sunctx);
  if (ark_mem->hadapt_mem->hcontroller == NULL)
  {
    arkProcessError(NULL, ARK_MEM_FAIL, __LINE__, __func__, __FILE__,
                    "Allocation of step controller object failed");
    ARKodeFree((void**)&ark_mem);
    return (NULL);
  }
  ark_mem->hadapt_mem->owncontroller = SUNTRUE;
  (void)SUNAdaptController_Space(ark_mem->hadapt_mem->hcontroller, &lenrw,
                                 &leniw);
  ark_mem->lrw += lenrw;
  ark_mem->liw += leniw;

  /* Initialize the interpolation structure to NULL */
  ark_mem->interp        = NULL;
  ark_mem->interp_type   = ARK_INTERP_HERMITE;
  ark_mem->interp_degree = ARK_INTERP_MAX_DEGREE;

  /* Initially, rwt should point to ewt */
  ark_mem->rwt_is_ewt = SUNTRUE;

  /* Indicate that calling the full RHS function is not required, this flag is
     updated to SUNTRUE by the interpolation module initialization function
     and/or the stepper initialization function in arkInitialSetup */
  ark_mem->call_fullrhs = SUNFALSE;

  /* Indicate that the problem needs to be initialized */
  ark_mem->initsetup   = SUNTRUE;
  ark_mem->init_type   = FIRST_INIT;
  ark_mem->firststage  = SUNTRUE;
  ark_mem->initialized = SUNFALSE;

  /* Initial step size has not been determined yet */
  ark_mem->h   = ZERO;
  ark_mem->h0u = ZERO;

  /* Set default values for integrator optional inputs */
  iret = ARKodeSetDefaults(ark_mem);
  if (iret != ARK_SUCCESS)
  {
    arkProcessError(NULL, 0, __LINE__, __func__, __FILE__,
                    "Error setting default solver options");
    ARKodeFree((void**)&ark_mem);
    return (NULL);
  }

  /* Return pointer to ARKODE memory block */
  return (ark_mem);
}